

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::add_composite_member_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,SPIRType *var_type,uint32_t mbr_idx,InterfaceBlockMeta *meta,
          string *mbr_name_qual,string *var_chain_qual,uint32_t *location,uint32_t *var_mbr_idx,
          Bitset *interpolation_qual)

{
  code *pcVar1;
  Vector<std::function<void_()>_> *this_00;
  uint32_t index;
  size_t sVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  SPIRType *pSVar9;
  undefined8 extraout_RAX;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *this_01;
  size_type sVar10;
  size_type sVar11;
  mapped_type *pmVar12;
  _func_void *p_Var13;
  CompilerError *pCVar14;
  ulong uVar15;
  SPIRType *pSVar16;
  SPIRType *ts_1;
  uint32_t sub_mbr_idx;
  uint32_t uVar17;
  CompilerMSL *this_02;
  char (*pacVar18) [2];
  SPIRType *ts_3;
  bool local_255;
  bool local_254;
  bool local_253;
  bool local_252;
  uint local_24c;
  SPIRType *local_248;
  SPIRType *local_240;
  StorageClass local_234;
  allocator local_22e;
  allocator local_22d;
  BuiltIn builtin;
  SPIRVariable *local_228;
  uint32_t local_220;
  undefined4 local_21c;
  _Any_data local_218;
  code *local_208;
  code *pcStack_200;
  string mbr_name;
  undefined8 local_1d8;
  undefined1 local_1d0;
  undefined7 uStack_1cf;
  undefined1 *puStack_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  undefined8 uStack_1b0;
  ulong *local_1a8;
  undefined1 *local_1a0;
  ulong local_198;
  undefined1 uStack_190;
  undefined7 uStack_18f;
  uint local_188;
  undefined4 uStack_184;
  undefined1 *local_180;
  undefined8 local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  undefined8 uStack_168;
  SPIRFunction *local_160;
  SPIRType *local_158;
  string *local_150;
  string var_chain_1;
  string var_chain;
  string flatten_from_ib_mbr_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Bitset local_90;
  string local_50;
  
  ts_3 = var_type;
  local_240 = ib_type;
  local_228 = var;
  local_150 = ib_var_ref;
  local_160 = Compiler::get<spirv_cross::SPIRFunction>
                        ((Compiler *)this,
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  builtin = BuiltInMax;
  bVar5 = Compiler::is_member_builtin((Compiler *)this,var_type,mbr_idx,&builtin);
  local_254 = true;
  local_253 = true;
  if ((interpolation_qual->lower & 0x4000) == 0) {
    bVar6 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                       DecorationFlat);
    local_253 = true;
    if (!bVar6) {
      local_253 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(local_228->super_IVariant).self.id,DecorationFlat
                            );
    }
  }
  if (((interpolation_qual->lower & 0x2000) == 0) &&
     (bVar6 = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                         DecorationNoPerspective), !bVar6)) {
    local_254 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(local_228->super_IVariant).self.id,
                           DecorationNoPerspective);
  }
  local_252 = true;
  local_255 = true;
  if ((interpolation_qual->lower & 0x10000) == 0) {
    bVar6 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,Centroid)
    ;
    local_255 = true;
    if (!bVar6) {
      local_255 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(local_228->super_IVariant).self.id,Centroid);
    }
  }
  if (((interpolation_qual->lower & 0x20000) == 0) &&
     (bVar6 = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                         DecorationSample), !bVar6)) {
    local_252 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(local_228->super_IVariant).self.id,DecorationSample
                          );
  }
  local_90.higher._M_h._M_buckets = &local_90.higher._M_h._M_single_bucket;
  local_90.lower = 0;
  local_90.higher._M_h._M_bucket_count = 1;
  local_90.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90.higher._M_h._M_element_count = 0;
  local_90.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_90.higher._M_h._M_rehash_policy._M_next_resize = 0;
  local_90.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if ((byte)(local_255 | local_252 | local_253 | local_254) == 1) {
    uVar15 = (ulong)local_253 * 0x4000 + 0x2000;
    if (local_254 == false) {
      uVar15 = (ulong)local_253 * 0x4000;
    }
    uVar8 = uVar15 + 0x10000;
    if (local_255 == false) {
      uVar8 = uVar15;
    }
    local_90.lower = uVar8 | 0x20000;
    if (local_252 == false) {
      local_90.lower = uVar8;
    }
  }
  uVar17 = (var_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
           ptr[mbr_idx].id;
  local_248 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar17);
  bVar6 = Compiler::is_matrix((Compiler *)this,local_248);
  if (bVar6) {
    bVar6 = Compiler::is_array((Compiler *)this,local_248);
    if (bVar6) {
      pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar14,"MSL cannot emit arrays-of-matrices in input and output variables.");
LAB_0024e2b4:
      __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_220 = local_248->columns;
    bVar6 = true;
  }
  else {
    bVar6 = Compiler::is_array((Compiler *)this,local_248);
    if (bVar6) {
      if ((local_248->array).super_VectorView<unsigned_int>.buffer_size != 1) {
        pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar14,"MSL cannot emit arrays-of-arrays in input and output variables.");
        goto LAB_0024e2b4;
      }
      local_220 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_248);
      bVar6 = true;
    }
    else {
      local_220 = 1;
      bVar6 = false;
    }
  }
  pSVar9 = local_248;
  if (local_248->pointer != false) {
    pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(local_248->parent_type).id);
  }
  while ((bVar7 = Compiler::is_array((Compiler *)this,pSVar9), bVar7 ||
         (bVar7 = Compiler::is_matrix((Compiler *)this,pSVar9), pSVar16 = local_240, bVar7))) {
    pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar9->parent_type).id);
  }
  flatten_from_ib_mbr_name._M_dataplus._M_p = (pointer)&flatten_from_ib_mbr_name.field_2;
  flatten_from_ib_mbr_name._M_string_length = 0;
  flatten_from_ib_mbr_name.field_2._M_local_buf[0] = '\0';
  if (storage == Output) {
    if (builtin == BuiltInClipDistance && bVar5) {
      index = (uint32_t)
              (local_240->member_types).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
      mbr_name._M_dataplus._M_p._0_4_ = uVar17;
      local_234 = storage;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                (&local_240->member_types,(TypedID<(spirv_cross::Types)1> *)&mbr_name);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(pSVar16->super_IVariant).self.id,index,BuiltIn,3);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(&mbr_name,this,3);
      ::std::__cxx11::string::operator=((string *)&flatten_from_ib_mbr_name,(string *)&mbr_name);
      ::std::__cxx11::string::~string((string *)&mbr_name);
      Compiler::set_member_name
                ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,index,
                 &flatten_from_ib_mbr_name);
      local_21c = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      storage = local_234;
      if ((this->msl_options).enable_clip_distance_user_varying == false) goto LAB_0024d5ce;
    }
    else {
      local_21c = 0;
    }
  }
  else {
    local_21c = 0;
  }
  local_158 = var_type;
  if (local_248->basetype == Struct) {
    pSVar9 = local_248;
    for (local_24c = 0; local_24c < local_220; local_24c = local_24c + 1) {
      pacVar18 = (char (*) [2])(ulong)mbr_idx;
      pSVar16 = local_158;
      append_member_name(&var_chain,this,mbr_name_qual,local_158,mbr_idx);
      if (bVar6) {
        join<char_const(&)[2],unsigned_int&>
                  (&var_chain_1,(spirv_cross *)0x38a666,(char (*) [2])&local_24c,(uint *)pSVar16);
      }
      else {
        ::std::__cxx11::string::string((string *)&var_chain_1,"",&local_22d);
      }
      ::std::operator+(&mbr_name,&var_chain,&var_chain_1);
      ::std::__cxx11::string::~string((string *)&var_chain_1);
      ::std::__cxx11::string::~string((string *)&var_chain);
      CompilerGLSL::to_member_name_abi_cxx11_
                (&var_chain_1,&this->super_CompilerGLSL,local_158,mbr_idx);
      if (bVar6) {
        join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                  ((string *)&local_218,(spirv_cross *)0x349808,(char (*) [2])&local_24c,
                   (uint *)0x38a005,pacVar18);
      }
      else {
        ::std::__cxx11::string::string((string *)local_218._M_pod_data,"",&local_22e);
      }
      join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,std::__cxx11::string>
                (&var_chain,(spirv_cross *)var_chain_qual,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x352557,
                 (char (*) [2])&var_chain_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_3);
      ::std::__cxx11::string::~string((string *)local_218._M_pod_data);
      ::std::__cxx11::string::~string((string *)&var_chain_1);
      sVar2 = (pSVar9->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size;
      for (uVar17 = 0; (uint32_t)sVar2 != uVar17; uVar17 = uVar17 + 1) {
        add_composite_member_variable_to_interface_block
                  (this,storage,local_150,local_240,local_228,pSVar9,uVar17,meta,&mbr_name,
                   &var_chain,location,var_mbr_idx,&local_90);
        *var_mbr_idx = *var_mbr_idx + 1;
        ts_3 = pSVar9;
        pSVar9 = local_248;
      }
      ::std::__cxx11::string::~string((string *)&var_chain);
      ::std::__cxx11::string::~string((string *)&mbr_name);
    }
  }
  else {
    this_01 = &local_240->member_types;
    this_00 = &local_160->fixup_hooks_out;
    local_160 = (SPIRFunction *)&local_160->fixup_hooks_in;
    local_234 = storage;
    for (local_24c = 0; uVar3 = local_1d8, local_24c < local_220; local_24c = local_24c + 1) {
      local_248 = (SPIRType *)
                  CONCAT44(local_248._4_4_,
                           (int)(local_240->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                buffer_size);
      if (local_234 == Input) {
        mbr_name._M_dataplus._M_p._0_4_ = (local_228->super_IVariant).self.id;
        sVar10 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&(this->pull_model_inputs)._M_h,(key_type_conflict *)&mbr_name);
        if (sVar10 == 0) goto LAB_0024d8d1;
        uVar17 = build_msl_interpolant_type(this,(pSVar9->super_IVariant).self.id,local_254);
      }
      else {
LAB_0024d8d1:
        uVar17 = (pSVar9->super_IVariant).self.id;
      }
      mbr_name._M_dataplus._M_p._0_4_ = uVar17;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                (this_01,(TypedID<(spirv_cross::Types)1> *)&mbr_name);
      pSVar16 = local_158;
      ts_1 = local_158;
      append_member_name(&mbr_name,this,mbr_name_qual,local_158,mbr_idx);
      if (bVar6) {
        join<char_const(&)[2],unsigned_int&>
                  (&var_chain_1,(spirv_cross *)0x38a666,(char (*) [2])&local_24c,(uint *)ts_1);
      }
      else {
        ::std::__cxx11::string::string((string *)&var_chain_1,"",&local_22d);
      }
      ::std::operator+(&local_b0,&mbr_name,&var_chain_1);
      this_02 = (CompilerMSL *)0x37fc8d;
      ::std::__cxx11::string::string((string *)&local_50,"m",(allocator *)local_218._M_pod_data);
      ensure_valid_name(&var_chain,this_02,&local_b0,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&var_chain_1);
      ::std::__cxx11::string::~string((string *)&mbr_name);
      Compiler::set_member_name
                ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,(uint32_t)local_248,
                 &var_chain);
      if (*location == 0xffffffff || bVar5) {
        bVar7 = Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)(pSVar16->super_IVariant).self.id,mbr_idx,
                           DecorationLocation);
        if (bVar7) {
          uVar17 = Compiler::get_member_decoration
                             ((Compiler *)this,(TypeID)(pSVar16->super_IVariant).self.id,mbr_idx,
                              DecorationLocation);
          *location = uVar17 + local_24c;
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,
                     (uint32_t)local_248,DecorationLocation,uVar17 + local_24c);
          mark_location_as_used_by_shader(this,*location,pSVar9,local_234,false);
          goto LAB_0024daa8;
        }
        bVar7 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(local_228->super_IVariant).self.id,
                           DecorationLocation);
        if (bVar7) {
          uVar17 = CompilerGLSL::get_accumulated_member_location
                             (&this->super_CompilerGLSL,local_228,mbr_idx,meta->strip_array);
          *location = uVar17 + local_24c;
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,
                     (uint32_t)local_248,DecorationLocation,uVar17 + local_24c);
          mark_location_as_used_by_shader(this,*location,pSVar9,local_234,false);
          goto LAB_0024daa8;
        }
        if (bVar5) {
          bVar7 = Compiler::is_tessellation_shader((Compiler *)this);
          if (bVar7 && local_234 == Input) {
            mbr_name._M_dataplus._M_p._0_4_ = builtin;
            sVar11 = ::std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::count(&(this->inputs_by_builtin)._M_h,(key_type_conflict *)&mbr_name);
            if (sVar11 != 0) {
              mbr_name._M_dataplus._M_p._0_4_ = builtin;
              pmVar12 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&this->inputs_by_builtin,(key_type *)&mbr_name);
              uVar17 = local_24c + pmVar12->location;
              *location = uVar17;
              Compiler::set_member_decoration
                        ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,
                         (uint32_t)local_248,DecorationLocation,uVar17);
              mark_location_as_used_by_shader(this,*location,pSVar9,Input,false);
              goto LAB_0024daa8;
            }
          }
          else if ((local_234 == Output) && ((this->capture_output_to_buffer & 1U) != 0)) {
            mbr_name._M_dataplus._M_p._0_4_ = builtin;
            sVar11 = ::std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::count(&(this->outputs_by_builtin)._M_h,(key_type_conflict *)&mbr_name);
            if (sVar11 != 0) {
              mbr_name._M_dataplus._M_p._0_4_ = builtin;
              pmVar12 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&this->outputs_by_builtin,(key_type *)&mbr_name);
              uVar17 = local_24c + pmVar12->location;
              *location = uVar17;
              Compiler::set_member_decoration
                        ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,
                         (uint32_t)local_248,DecorationLocation,uVar17);
              mark_location_as_used_by_shader(this,*location,pSVar9,Output,false);
              goto LAB_0024daa8;
            }
          }
          if (builtin - BuiltInClipDistance < 2) {
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,
                       (uint32_t)local_248,BuiltIn,builtin);
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,
                       (uint32_t)local_248,DecorationIndex,local_24c);
          }
        }
      }
      else {
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,(uint32_t)local_248,
                   DecorationLocation,*location);
        mark_location_as_used_by_shader(this,*location,pSVar9,local_234,false);
LAB_0024daa8:
        *location = *location + 1;
      }
      bVar7 = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(pSVar16->super_IVariant).self.id,mbr_idx,
                         Component);
      if (bVar7) {
        pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar14,"DecorationComponent on matrices and arrays is not supported.");
        __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (local_234 == Input) {
        mbr_name._M_dataplus._M_p._0_4_ = (local_228->super_IVariant).self.id;
        sVar10 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&(this->pull_model_inputs)._M_h,(key_type_conflict *)&mbr_name);
        if (sVar10 == 0) goto LAB_0024dafb;
      }
      else {
LAB_0024dafb:
        if (local_253 != false) {
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,
                     (uint32_t)local_248,DecorationFlat,0);
        }
        if (local_254 != false) {
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,
                     (uint32_t)local_248,DecorationNoPerspective,0);
        }
        if (local_255 != false) {
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,
                     (uint32_t)local_248,Centroid,0);
        }
        if (local_252 != false) {
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,
                     (uint32_t)local_248,DecorationSample,0);
        }
      }
      Compiler::set_extended_member_decoration
                ((Compiler *)this,(local_240->super_IVariant).self.id,(uint32_t)local_248,
                 SPIRVCrossDecorationInterfaceOrigID,(local_228->super_IVariant).self.id);
      pacVar18 = (char (*) [2])(ulong)*var_mbr_idx;
      Compiler::set_extended_member_decoration
                ((Compiler *)this,(local_240->super_IVariant).self.id,(uint32_t)local_248,
                 SPIRVCrossDecorationInterfaceMemberIndex,*var_mbr_idx);
      if ((meta->strip_array == false) && (meta->allow_local_declaration == true)) {
        CompilerGLSL::to_member_name_abi_cxx11_(&mbr_name,&this->super_CompilerGLSL,pSVar16,mbr_idx)
        ;
        if (bVar6) {
          join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    ((string *)&local_218,(spirv_cross *)0x349808,(char (*) [2])&local_24c,
                     (uint *)0x38a005,pacVar18);
        }
        else {
          ::std::__cxx11::string::string((string *)local_218._M_pod_data,"",&local_22e);
        }
        join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,std::__cxx11::string>
                  (&var_chain_1,(spirv_cross *)var_chain_qual,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x352557,
                   (char (*) [2])&mbr_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_3);
        ::std::__cxx11::string::~string((string *)local_218._M_pod_data);
        ::std::__cxx11::string::~string((string *)&mbr_name);
        if (local_234 == Input) {
          mbr_name._M_dataplus._M_p = (pointer)local_228;
          mbr_name.field_2._M_local_buf[1] = local_252;
          mbr_name.field_2._M_local_buf[0] = local_255;
          mbr_name._M_string_length = (size_type)this;
          ::std::__cxx11::string::string
                    ((string *)(mbr_name.field_2._M_local_buf + 8),(string *)&var_chain_1);
          ::std::__cxx11::string::string((string *)&local_1c0,(string *)local_150);
          ::std::__cxx11::string::string((string *)&local_1a0,(string *)&var_chain);
          local_208 = (code *)0x0;
          pcStack_200 = (code *)0x0;
          local_218._M_unused._M_object = (void *)0x0;
          local_218._8_8_ = 0;
          p_Var13 = (_func_void *)operator_new(0x78);
          *(undefined2 *)(p_Var13 + 0x10) = mbr_name.field_2._M_allocated_capacity._0_2_;
          *(pointer *)p_Var13 = mbr_name._M_dataplus._M_p;
          *(size_type *)(p_Var13 + 8) = mbr_name._M_string_length;
          pcVar1 = p_Var13 + 0x28;
          *(code **)(p_Var13 + 0x18) = pcVar1;
          if ((undefined1 *)mbr_name.field_2._8_8_ == &local_1d0) {
            *(ulong *)pcVar1 = CONCAT71(uStack_1cf,local_1d0);
            *(undefined1 **)(p_Var13 + 0x30) = puStack_1c8;
          }
          else {
            *(undefined8 *)(p_Var13 + 0x18) = mbr_name.field_2._8_8_;
            *(ulong *)pcVar1 = CONCAT71(uStack_1cf,local_1d0);
          }
          local_1d8 = 0;
          *(undefined8 *)(p_Var13 + 0x20) = uVar3;
          local_1d0 = 0;
          mbr_name.field_2._8_8_ = &local_1d0;
          ::std::__cxx11::string::string((string *)(p_Var13 + 0x38),(string *)&local_1c0);
          *(_func_void **)(p_Var13 + 0x58) = p_Var13 + 0x68;
          if (local_1a0 == &uStack_190) {
            *(ulong *)(p_Var13 + 0x68) = CONCAT71(uStack_18f,uStack_190);
            *(ulong *)(p_Var13 + 0x70) = CONCAT44(uStack_184,local_188);
          }
          else {
            *(undefined1 **)(p_Var13 + 0x58) = local_1a0;
            *(ulong *)(p_Var13 + 0x68) = CONCAT71(uStack_18f,uStack_190);
          }
          *(ulong *)(p_Var13 + 0x60) = local_198;
          local_198 = 0;
          uStack_190 = 0;
          pcStack_200 = ::std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3143:41)>
                        ::_M_invoke;
          local_208 = ::std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3143:41)>
                      ::_M_manager;
          local_218._M_unused._0_8_ = (undefined8)p_Var13;
          local_1a0 = &uStack_190;
          SmallVector<std::function<void_()>,_0UL>::push_back
                    ((SmallVector<std::function<void_()>,_0UL> *)local_160,
                     (function<void_()> *)&local_218);
          ::std::_Function_base::~_Function_base((_Function_base *)&local_218);
          add_composite_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&,spirv_cross::Bitset_const&)
          ::$_0::~__0((__0 *)&mbr_name);
        }
        else if (local_234 == Output) {
          mbr_name._M_dataplus._M_p._0_1_ = (char)local_21c;
          mbr_name._M_string_length = (size_type)this;
          ::std::__cxx11::string::string
                    ((string *)mbr_name.field_2._M_local_buf,(string *)local_150);
          ::std::__cxx11::string::string((string *)&puStack_1c8,(string *)&var_chain);
          ::std::__cxx11::string::string((string *)&local_1a8,(string *)&flatten_from_ib_mbr_name);
          local_188 = local_24c;
          ::std::__cxx11::string::string((string *)&local_180,(string *)&var_chain_1);
          local_208 = (code *)0x0;
          pcStack_200 = (code *)0x0;
          local_218._M_unused._M_object = (void *)0x0;
          local_218._8_8_ = 0;
          p_Var13 = (_func_void *)operator_new(0x98);
          *(pointer *)p_Var13 = mbr_name._M_dataplus._M_p;
          *(size_type *)(p_Var13 + 8) = mbr_name._M_string_length;
          ::std::__cxx11::string::string
                    ((string *)(p_Var13 + 0x10),(string *)mbr_name.field_2._M_local_buf);
          puVar4 = local_1a0;
          *(_func_void **)(p_Var13 + 0x30) = p_Var13 + 0x40;
          if (puStack_1c8 == &local_1b8) {
            *(ulong *)(p_Var13 + 0x40) = CONCAT71(uStack_1b7,local_1b8);
            *(undefined8 *)(p_Var13 + 0x48) = uStack_1b0;
          }
          else {
            *(undefined1 **)(p_Var13 + 0x30) = puStack_1c8;
            *(ulong *)(p_Var13 + 0x40) = CONCAT71(uStack_1b7,local_1b8);
          }
          *(undefined8 *)(p_Var13 + 0x38) = local_1c0;
          local_1c0 = 0;
          local_1b8 = 0;
          *(_func_void **)(p_Var13 + 0x50) = p_Var13 + 0x60;
          if (local_1a8 == &local_198) {
            *(ulong *)(p_Var13 + 0x60) = local_198;
            *(ulong *)(p_Var13 + 0x68) = CONCAT71(uStack_18f,uStack_190);
          }
          else {
            *(ulong **)(p_Var13 + 0x50) = local_1a8;
            *(ulong *)(p_Var13 + 0x60) = local_198;
          }
          local_1a0 = (undefined1 *)0x0;
          *(undefined1 **)(p_Var13 + 0x58) = puVar4;
          local_198 = local_198 & 0xffffffffffffff00;
          *(uint *)(p_Var13 + 0x70) = local_188;
          *(_func_void **)(p_Var13 + 0x78) = p_Var13 + 0x88;
          if (local_180 == &local_170) {
            *(ulong *)(p_Var13 + 0x88) = CONCAT71(uStack_16f,local_170);
            *(undefined8 *)(p_Var13 + 0x90) = uStack_168;
          }
          else {
            *(undefined1 **)(p_Var13 + 0x78) = local_180;
            *(ulong *)(p_Var13 + 0x88) = CONCAT71(uStack_16f,local_170);
          }
          *(undefined8 *)(p_Var13 + 0x80) = local_178;
          local_178 = 0;
          local_170 = 0;
          pcStack_200 = ::std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3159:42)>
                        ::_M_invoke;
          local_208 = ::std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3159:42)>
                      ::_M_manager;
          local_218._M_unused._0_8_ = (undefined8)p_Var13;
          puStack_1c8 = &local_1b8;
          local_1a8 = &local_198;
          local_180 = &local_170;
          SmallVector<std::function<void_()>,_0UL>::push_back
                    (this_00,(function<void_()> *)&local_218);
          ::std::_Function_base::~_Function_base((_Function_base *)&local_218);
          add_composite_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&,spirv_cross::Bitset_const&)
          ::$_1::~__1((__1 *)&mbr_name);
        }
        ::std::__cxx11::string::~string((string *)&var_chain_1);
      }
      ::std::__cxx11::string::~string((string *)&var_chain);
    }
  }
LAB_0024d5ce:
  ::std::__cxx11::string::~string((string *)&flatten_from_ib_mbr_name);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_90.higher._M_h);
  return;
}

Assistant:

void CompilerMSL::add_composite_member_variable_to_interface_block(StorageClass storage,
                                                                   const string &ib_var_ref, SPIRType &ib_type,
                                                                   SPIRVariable &var, SPIRType &var_type,
                                                                   uint32_t mbr_idx, InterfaceBlockMeta &meta,
                                                                   const string &mbr_name_qual,
                                                                   const string &var_chain_qual,
                                                                   uint32_t &location, uint32_t &var_mbr_idx,
                                                                   const Bitset &interpolation_qual)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
	bool is_flat = interpolation_qual.get(DecorationFlat) ||
	               has_member_decoration(var_type.self, mbr_idx, DecorationFlat) ||
	               has_decoration(var.self, DecorationFlat);
	bool is_noperspective = interpolation_qual.get(DecorationNoPerspective) ||
	                        has_member_decoration(var_type.self, mbr_idx, DecorationNoPerspective) ||
	                        has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = interpolation_qual.get(DecorationCentroid) ||
	                   has_member_decoration(var_type.self, mbr_idx, DecorationCentroid) ||
	                   has_decoration(var.self, DecorationCentroid);
	bool is_sample = interpolation_qual.get(DecorationSample) ||
	                 has_member_decoration(var_type.self, mbr_idx, DecorationSample) ||
	                 has_decoration(var.self, DecorationSample);

	Bitset inherited_qual;
	if (is_flat)
		inherited_qual.set(DecorationFlat);
	if (is_noperspective)
		inherited_qual.set(DecorationNoPerspective);
	if (is_centroid)
		inherited_qual.set(DecorationCentroid);
	if (is_sample)
		inherited_qual.set(DecorationSample);

	uint32_t mbr_type_id = var_type.member_types[mbr_idx];
	auto &mbr_type = get<SPIRType>(mbr_type_id);

	bool mbr_is_indexable = false;
	uint32_t elem_cnt = 1;
	if (is_matrix(mbr_type))
	{
		if (is_array(mbr_type))
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

		mbr_is_indexable = true;
		elem_cnt = mbr_type.columns;
	}
	else if (is_array(mbr_type))
	{
		if (mbr_type.array.size() != 1)
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

		mbr_is_indexable = true;
		elem_cnt = to_array_size_literal(mbr_type);
	}

	auto *usable_type = &mbr_type;
	if (usable_type->pointer)
		usable_type = &get<SPIRType>(usable_type->parent_type);
	while (is_array(*usable_type) || is_matrix(*usable_type))
		usable_type = &get<SPIRType>(usable_type->parent_type);

	bool flatten_from_ib_var = false;
	string flatten_from_ib_mbr_name;

	if (storage == StorageClassOutput && is_builtin && builtin == BuiltInClipDistance)
	{
		// Also declare [[clip_distance]] attribute here.
		uint32_t clip_array_mbr_idx = uint32_t(ib_type.member_types.size());
		ib_type.member_types.push_back(mbr_type_id);
		set_member_decoration(ib_type.self, clip_array_mbr_idx, DecorationBuiltIn, BuiltInClipDistance);

		flatten_from_ib_mbr_name = builtin_to_glsl(BuiltInClipDistance, StorageClassOutput);
		set_member_name(ib_type.self, clip_array_mbr_idx, flatten_from_ib_mbr_name);

		// When we flatten, we flatten directly from the "out" struct,
		// not from a function variable.
		flatten_from_ib_var = true;

		if (!msl_options.enable_clip_distance_user_varying)
			return;
	}

	// Recursively handle nested structures.
	if (mbr_type.basetype == SPIRType::Struct)
	{
		for (uint32_t i = 0; i < elem_cnt; i++)
		{
			string mbr_name = append_member_name(mbr_name_qual, var_type, mbr_idx) + (mbr_is_indexable ? join("_", i) : "");
			string var_chain = join(var_chain_qual, ".", to_member_name(var_type, mbr_idx), (mbr_is_indexable ? join("[", i, "]") : ""));
			uint32_t sub_mbr_cnt = uint32_t(mbr_type.member_types.size());
			for (uint32_t sub_mbr_idx = 0; sub_mbr_idx < sub_mbr_cnt; sub_mbr_idx++)
			{
				add_composite_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
																 var, mbr_type, sub_mbr_idx,
																 meta, mbr_name, var_chain,
																 location, var_mbr_idx, inherited_qual);
				// FIXME: Recursive structs and tessellation breaks here.
				var_mbr_idx++;
			}
		}
		return;
	}

	for (uint32_t i = 0; i < elem_cnt; i++)
	{
		// Add a reference to the variable type to the interface struct.
		uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());
		if (storage == StorageClassInput && pull_model_inputs.count(var.self))
			ib_type.member_types.push_back(build_msl_interpolant_type(usable_type->self, is_noperspective));
		else
			ib_type.member_types.push_back(usable_type->self);

		// Give the member a name
		string mbr_name = ensure_valid_name(append_member_name(mbr_name_qual, var_type, mbr_idx) + (mbr_is_indexable ? join("_", i) : ""), "m");
		set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

		// Once we determine the location of the first member within nested structures,
		// from a var of the topmost structure, the remaining flattened members of
		// the nested structures will have consecutive location values. At this point,
		// we've recursively tunnelled into structs, arrays, and matrices, and are
		// down to a single location for each member now.
		if (!is_builtin && location != UINT32_MAX)
		{
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (has_member_decoration(var_type.self, mbr_idx, DecorationLocation))
		{
			location = get_member_decoration(var_type.self, mbr_idx, DecorationLocation) + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (has_decoration(var.self, DecorationLocation))
		{
			location = get_accumulated_member_location(var, mbr_idx, meta.strip_array) + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (is_builtin && is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
		{
			location = inputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (is_builtin && capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
		{
			location = outputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (is_builtin && (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance))
		{
			// Declare the Clip/CullDistance as [[user(clip/cullN)]].
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationIndex, i);
		}

		if (has_member_decoration(var_type.self, mbr_idx, DecorationComponent))
			SPIRV_CROSS_THROW("DecorationComponent on matrices and arrays is not supported.");

		if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
		{
			// Copy interpolation decorations if needed
			if (is_flat)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
			if (is_noperspective)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
			if (is_centroid)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
			if (is_sample)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
		}

		set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);
		set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex, var_mbr_idx);

		// Unflatten or flatten from [[stage_in]] or [[stage_out]] as appropriate.
		if (!meta.strip_array && meta.allow_local_declaration)
		{
			string var_chain = join(var_chain_qual, ".", to_member_name(var_type, mbr_idx), (mbr_is_indexable ? join("[", i, "]") : ""));
			switch (storage)
			{
			case StorageClassInput:
				entry_func.fixup_hooks_in.push_back([=, &var]() {
					string lerp_call;
					if (pull_model_inputs.count(var.self))
					{
						if (is_centroid)
							lerp_call = ".interpolate_at_centroid()";
						else if (is_sample)
							lerp_call = join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
						else
							lerp_call = ".interpolate_at_center()";
					}
					statement(var_chain, " = ", ib_var_ref, ".", mbr_name, lerp_call, ";");
				});
				break;

			case StorageClassOutput:
				entry_func.fixup_hooks_out.push_back([=]() {
					if (flatten_from_ib_var)
						statement(ib_var_ref, ".", mbr_name, " = ", ib_var_ref, ".", flatten_from_ib_mbr_name, "[", i, "];");
					else
						statement(ib_var_ref, ".", mbr_name, " = ", var_chain, ";");
				});
				break;

			default:
				break;
			}
		}
	}
}